

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O3

void convolve_2d_sr_ver_2tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined4 uVar4;
  int32_t y;
  long lVar5;
  int16_t *im;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [32];
  int iVar8;
  undefined1 (*pauVar9) [32];
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m128i d0;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  
  uVar4 = *(undefined4 *)
           (filter_params_y->filter_ptr +
           (ulong)((subpel_y_q4 & 0xfU) * (uint)filter_params_y->taps) + 3);
  if (w < 5) {
    auVar11._4_4_ = uVar4;
    auVar11._0_4_ = uVar4;
    auVar11._8_4_ = uVar4;
    auVar11._12_4_ = uVar4;
    if (w == 2) {
      uVar10 = *(uint *)im_block;
      lVar5 = 0;
      auVar19._8_4_ = 0x400;
      auVar19._0_8_ = 0x40000000400;
      auVar19._12_4_ = 0x400;
      do {
        auVar18 = vpinsrd_avx(ZEXT416(uVar10),*(undefined4 *)(im_block + lVar5 * 2 + 2),1);
        uVar10 = *(uint *)(im_block + lVar5 * 2 + 4);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = *(ulong *)(im_block + lVar5 * 2 + 2);
        auVar18 = vpunpcklwd_avx(auVar18,auVar14);
        auVar18 = vpmaddwd_avx(auVar18,auVar11);
        auVar18 = vpaddd_avx(auVar18,auVar19);
        auVar18 = vpsrad_avx(auVar18,0xb);
        auVar18 = vpackssdw_avx(auVar18,auVar18);
        auVar18 = vpackuswb_avx(auVar18,auVar18);
        vpextrw_avx(auVar18,0);
        vpextrw_avx(auVar18,1);
        lVar5 = lVar5 + 2;
      } while (h != (int)lVar5);
    }
    else {
      auVar17 = ZEXT864(*(ulong *)im_block);
      lVar5 = 0;
      auVar18._8_4_ = 0x400;
      auVar18._0_8_ = 0x40000000400;
      auVar18._12_4_ = 0x400;
      do {
        auVar19 = *(undefined1 (*) [16])(im_block + lVar5 * 4 + 4);
        auVar23._8_8_ = auVar19._0_8_;
        auVar23._0_8_ = auVar19._0_8_;
        auVar14 = vpunpcklwd_avx(auVar17._0_16_,auVar19);
        auVar26 = vpsrldq_avx(auVar19,8);
        auVar23 = vpunpckhwd_avx(auVar23,auVar19);
        auVar19 = vpmaddwd_avx(auVar14,auVar11);
        auVar23 = vpmaddwd_avx(auVar23,auVar11);
        auVar19 = vpaddd_avx(auVar19,auVar18);
        auVar14 = vpsrad_avx(auVar19,0xb);
        auVar19 = vpaddd_avx(auVar23,auVar18);
        auVar19 = vpsrad_avx(auVar19,0xb);
        auVar19 = vpackssdw_avx(auVar14,auVar19);
        auVar19 = vpackuswb_avx(auVar19,auVar19);
        *(int *)dst = auVar19._0_4_;
        iVar8 = vpextrw_avx(auVar19,3);
        uVar10 = vpextrw_avx(auVar19,2);
        *(uint *)(dst + dst_stride) = uVar10 | iVar8 << 0x10;
        dst = dst + dst_stride * 2;
        lVar5 = lVar5 + 2;
        auVar17 = ZEXT1664(auVar26);
      } while (h != (int)lVar5);
    }
  }
  else {
    auVar12._4_4_ = uVar4;
    auVar12._0_4_ = uVar4;
    auVar12._8_4_ = uVar4;
    auVar12._12_4_ = uVar4;
    auVar12._16_4_ = uVar4;
    auVar12._20_4_ = uVar4;
    auVar12._24_4_ = uVar4;
    auVar12._28_4_ = uVar4;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      auVar11 = *(undefined1 (*) [16])im_block;
      pauVar6 = (undefined1 (*) [16])(im_block + 0x10);
      auVar24._8_4_ = 0x400;
      auVar24._0_8_ = 0x40000000400;
      auVar24._12_4_ = 0x400;
      auVar24._16_4_ = 0x400;
      auVar24._20_4_ = 0x400;
      auVar24._24_4_ = 0x400;
      auVar24._28_4_ = 0x400;
      do {
        auVar16._0_16_ = ZEXT116(0) * pauVar6[-1] + ZEXT116(1) * auVar11;
        auVar16._16_16_ = ZEXT116(1) * pauVar6[-1];
        auVar11 = *pauVar6;
        auVar21 = vpunpcklwd_avx2(auVar16,*(undefined1 (*) [32])(pauVar6 + -1));
        auVar29 = vpunpckhwd_avx2(auVar16,*(undefined1 (*) [32])(pauVar6 + -1));
        auVar21 = vpmaddwd_avx2(auVar21,auVar12);
        auVar29 = vpmaddwd_avx2(auVar29,auVar12);
        auVar21 = vpaddd_avx2(auVar21,auVar24);
        auVar16 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpaddd_avx2(auVar29,auVar24);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpackssdw_avx2(auVar16,auVar21);
        auVar21 = vpackuswb_avx2(auVar21,auVar12);
        *(long *)dst = auVar21._0_8_;
        *(long *)(dst + dst_stride) = auVar21._16_8_;
        dst = dst + dst_stride * 2;
        pauVar6 = pauVar6 + 2;
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      auVar24 = *(undefined1 (*) [32])im_block;
      pauVar7 = (undefined1 (*) [32])(im_block + 0x20);
      auVar21._8_4_ = 0x400;
      auVar21._0_8_ = 0x40000000400;
      auVar21._12_4_ = 0x400;
      auVar21._16_4_ = 0x400;
      auVar21._20_4_ = 0x400;
      auVar21._24_4_ = 0x400;
      auVar21._28_4_ = 0x400;
      do {
        auVar29 = pauVar7[-1];
        auVar16 = vpunpcklwd_avx2(auVar24,auVar29);
        auVar25 = vpunpckhwd_avx2(auVar24,auVar29);
        auVar24 = *pauVar7;
        auVar16 = vpmaddwd_avx2(auVar16,auVar12);
        auVar25 = vpmaddwd_avx2(auVar25,auVar12);
        auVar22 = vpunpcklwd_avx2(auVar29,auVar24);
        auVar29 = vpunpckhwd_avx2(auVar29,auVar24);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar28 = vpmaddwd_avx2(auVar29,auVar12);
        auVar29 = vpaddd_avx2(auVar16,auVar21);
        auVar16 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpaddd_avx2(auVar25,auVar21);
        auVar29 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpackssdw_avx2(auVar16,auVar29);
        auVar16 = vpaddd_avx2(auVar22,auVar21);
        auVar25 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpaddd_avx2(auVar28,auVar21);
        auVar16 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpackssdw_avx2(auVar25,auVar16);
        auVar29 = vpackuswb_avx2(auVar29,auVar16);
        auVar29 = vpermq_avx2(auVar29,0xd8);
        *(undefined1 (*) [16])dst = auVar29._0_16_;
        *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar29._16_16_;
        dst = *(undefined1 (*) [16])dst + dst_stride * 2;
        pauVar7 = pauVar7 + 2;
        h = h + -2;
      } while (h != 0);
      break;
    default:
      auVar16 = *(undefined1 (*) [32])im_block;
      auVar25 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar21 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar24 = *(undefined1 (*) [32])(im_block + 0x30);
      auVar22 = *(undefined1 (*) [32])(im_block + 0x40);
      auVar28 = *(undefined1 (*) [32])(im_block + 0x50);
      auVar30 = *(undefined1 (*) [32])(im_block + 0x60);
      auVar29 = *(undefined1 (*) [32])(im_block + 0x70);
      lVar5 = (long)dst_stride;
      pauVar7 = (undefined1 (*) [32])(im_block + 0x170);
      pauVar9 = (undefined1 (*) [32])(dst + 0x60);
      auVar13._8_4_ = 0x400;
      auVar13._0_8_ = 0x40000000400;
      auVar13._12_4_ = 0x400;
      auVar13._16_4_ = 0x400;
      auVar13._20_4_ = 0x400;
      auVar13._24_4_ = 0x400;
      auVar13._28_4_ = 0x400;
      do {
        auVar27 = pauVar7[-0xf];
        auVar31 = pauVar7[-0xe];
        auVar32 = vpunpcklwd_avx2(auVar16,auVar27);
        auVar20 = vpunpckhwd_avx2(auVar16,auVar27);
        auVar16 = vpmaddwd_avx2(auVar32,auVar12);
        auVar15 = vpunpcklwd_avx2(auVar25,auVar31);
        auVar20 = vpmaddwd_avx2(auVar20,auVar12);
        auVar32 = vpunpckhwd_avx2(auVar25,auVar31);
        auVar25 = vpmaddwd_avx2(auVar15,auVar12);
        auVar32 = vpmaddwd_avx2(auVar32,auVar12);
        auVar16 = vpaddd_avx2(auVar16,auVar13);
        auVar15 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpaddd_avx2(auVar20,auVar13);
        auVar25 = vpaddd_avx2(auVar25,auVar13);
        auVar20 = vpsrad_avx2(auVar16,0xb);
        auVar25 = vpsrad_avx2(auVar25,0xb);
        auVar16 = vpaddd_avx2(auVar32,auVar13);
        auVar32 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpackssdw_avx2(auVar15,auVar20);
        auVar25 = vpackssdw_avx2(auVar25,auVar32);
        auVar16 = vpackuswb_avx2(auVar16,auVar25);
        pauVar9[-3] = auVar16;
        auVar20 = pauVar7[-0xd];
        auVar32 = pauVar7[-0xc];
        auVar25 = vpunpcklwd_avx2(auVar21,auVar20);
        auVar16 = vpunpckhwd_avx2(auVar21,auVar20);
        auVar21 = vpmaddwd_avx2(auVar25,auVar12);
        auVar16 = vpmaddwd_avx2(auVar16,auVar12);
        auVar25 = vpunpcklwd_avx2(auVar24,auVar32);
        auVar24 = vpunpckhwd_avx2(auVar24,auVar32);
        auVar25 = vpmaddwd_avx2(auVar25,auVar12);
        auVar15 = vpmaddwd_avx2(auVar24,auVar12);
        auVar24 = vpaddd_avx2(auVar21,auVar13);
        auVar21 = vpaddd_avx2(auVar16,auVar13);
        auVar16 = vpsrad_avx2(auVar24,0xb);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar24 = vpaddd_avx2(auVar25,auVar13);
        auVar25 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar16,auVar21);
        auVar21 = vpaddd_avx2(auVar15,auVar13);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpackssdw_avx2(auVar25,auVar21);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        pauVar9[-2] = auVar24;
        auVar15 = pauVar7[-0xb];
        auVar1 = pauVar7[-10];
        auVar24 = vpunpcklwd_avx2(auVar22,auVar15);
        auVar21 = vpunpckhwd_avx2(auVar22,auVar15);
        auVar24 = vpmaddwd_avx2(auVar24,auVar12);
        auVar16 = vpunpcklwd_avx2(auVar28,auVar1);
        auVar21 = vpmaddwd_avx2(auVar21,auVar12);
        auVar25 = vpunpckhwd_avx2(auVar28,auVar1);
        auVar16 = vpmaddwd_avx2(auVar16,auVar12);
        auVar25 = vpmaddwd_avx2(auVar25,auVar12);
        auVar24 = vpaddd_avx2(auVar24,auVar13);
        auVar22 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpaddd_avx2(auVar21,auVar13);
        auVar21 = vpaddd_avx2(auVar16,auVar13);
        auVar16 = vpsrad_avx2(auVar24,0xb);
        auVar28 = vpsrad_avx2(auVar21,0xb);
        auVar24 = vpaddd_avx2(auVar25,auVar13);
        auVar21 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar22,auVar16);
        auVar21 = vpackssdw_avx2(auVar28,auVar21);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        pauVar9[-1] = auVar24;
        auVar2 = pauVar7[-9];
        auVar3 = pauVar7[-8];
        auVar24 = vpunpcklwd_avx2(auVar30,auVar2);
        auVar21 = vpunpckhwd_avx2(auVar30,auVar2);
        auVar24 = vpmaddwd_avx2(auVar24,auVar12);
        auVar21 = vpmaddwd_avx2(auVar21,auVar12);
        auVar25 = vpunpcklwd_avx2(auVar29,auVar3);
        auVar16 = vpunpckhwd_avx2(auVar29,auVar3);
        auVar29 = vpmaddwd_avx2(auVar25,auVar12);
        auVar16 = vpmaddwd_avx2(auVar16,auVar12);
        auVar24 = vpaddd_avx2(auVar24,auVar13);
        auVar21 = vpaddd_avx2(auVar21,auVar13);
        auVar25 = vpsrad_avx2(auVar24,0xb);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar24 = vpaddd_avx2(auVar29,auVar13);
        auVar29 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar25,auVar21);
        auVar21 = vpaddd_avx2(auVar16,auVar13);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpackssdw_avx2(auVar29,auVar21);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        *pauVar9 = auVar24;
        auVar16 = pauVar7[-7];
        auVar25 = pauVar7[-6];
        auVar24 = vpunpcklwd_avx2(auVar27,auVar16);
        auVar21 = vpunpckhwd_avx2(auVar27,auVar16);
        auVar24 = vpmaddwd_avx2(auVar24,auVar12);
        auVar29 = vpunpcklwd_avx2(auVar31,auVar25);
        auVar21 = vpmaddwd_avx2(auVar21,auVar12);
        auVar22 = vpunpckhwd_avx2(auVar31,auVar25);
        auVar29 = vpmaddwd_avx2(auVar29,auVar12);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar24 = vpaddd_avx2(auVar24,auVar13);
        auVar28 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpaddd_avx2(auVar21,auVar13);
        auVar21 = vpaddd_avx2(auVar29,auVar13);
        auVar29 = vpsrad_avx2(auVar24,0xb);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar24 = vpaddd_avx2(auVar22,auVar13);
        auVar22 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar28,auVar29);
        auVar21 = vpackssdw_avx2(auVar21,auVar22);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        *(undefined1 (*) [32])(pauVar9[-3] + lVar5) = auVar24;
        auVar21 = pauVar7[-5];
        auVar24 = pauVar7[-4];
        auVar29 = vpunpcklwd_avx2(auVar20,auVar21);
        auVar22 = vpunpckhwd_avx2(auVar20,auVar21);
        auVar29 = vpmaddwd_avx2(auVar29,auVar12);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar28 = vpunpcklwd_avx2(auVar32,auVar24);
        auVar30 = vpunpckhwd_avx2(auVar32,auVar24);
        auVar28 = vpmaddwd_avx2(auVar28,auVar12);
        auVar30 = vpmaddwd_avx2(auVar30,auVar12);
        auVar29 = vpaddd_avx2(auVar29,auVar13);
        auVar22 = vpaddd_avx2(auVar22,auVar13);
        auVar27 = vpsrad_avx2(auVar29,0xb);
        auVar22 = vpsrad_avx2(auVar22,0xb);
        auVar29 = vpaddd_avx2(auVar28,auVar13);
        auVar28 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpackssdw_avx2(auVar27,auVar22);
        auVar22 = vpaddd_avx2(auVar30,auVar13);
        auVar22 = vpsrad_avx2(auVar22,0xb);
        auVar22 = vpackssdw_avx2(auVar28,auVar22);
        auVar29 = vpackuswb_avx2(auVar29,auVar22);
        *(undefined1 (*) [32])(pauVar9[-2] + lVar5) = auVar29;
        auVar22 = pauVar7[-3];
        auVar28 = pauVar7[-2];
        auVar29 = vpunpcklwd_avx2(auVar15,auVar22);
        auVar30 = vpunpckhwd_avx2(auVar15,auVar22);
        auVar29 = vpmaddwd_avx2(auVar29,auVar12);
        auVar27 = vpunpcklwd_avx2(auVar1,auVar28);
        auVar30 = vpmaddwd_avx2(auVar30,auVar12);
        auVar31 = vpunpckhwd_avx2(auVar1,auVar28);
        auVar27 = vpmaddwd_avx2(auVar27,auVar12);
        auVar31 = vpmaddwd_avx2(auVar31,auVar12);
        auVar29 = vpaddd_avx2(auVar29,auVar13);
        auVar20 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpaddd_avx2(auVar30,auVar13);
        auVar30 = vpaddd_avx2(auVar27,auVar13);
        auVar27 = vpsrad_avx2(auVar29,0xb);
        auVar30 = vpsrad_avx2(auVar30,0xb);
        auVar29 = vpaddd_avx2(auVar31,auVar13);
        auVar31 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpackssdw_avx2(auVar20,auVar27);
        auVar30 = vpackssdw_avx2(auVar30,auVar31);
        auVar29 = vpackuswb_avx2(auVar29,auVar30);
        *(undefined1 (*) [32])(pauVar9[-1] + lVar5) = auVar29;
        auVar30 = pauVar7[-1];
        auVar29 = *pauVar7;
        auVar27 = vpunpcklwd_avx2(auVar2,auVar30);
        auVar31 = vpunpckhwd_avx2(auVar2,auVar30);
        auVar27 = vpmaddwd_avx2(auVar27,auVar12);
        auVar31 = vpmaddwd_avx2(auVar31,auVar12);
        auVar20 = vpunpcklwd_avx2(auVar3,auVar29);
        auVar32 = vpunpckhwd_avx2(auVar3,auVar29);
        auVar20 = vpmaddwd_avx2(auVar20,auVar12);
        auVar32 = vpmaddwd_avx2(auVar32,auVar12);
        auVar27 = vpaddd_avx2(auVar27,auVar13);
        auVar31 = vpaddd_avx2(auVar31,auVar13);
        auVar15 = vpsrad_avx2(auVar27,0xb);
        auVar31 = vpsrad_avx2(auVar31,0xb);
        auVar27 = vpaddd_avx2(auVar20,auVar13);
        auVar20 = vpsrad_avx2(auVar27,0xb);
        auVar27 = vpackssdw_avx2(auVar15,auVar31);
        auVar31 = vpaddd_avx2(auVar32,auVar13);
        auVar31 = vpsrad_avx2(auVar31,0xb);
        auVar31 = vpackssdw_avx2(auVar20,auVar31);
        auVar27 = vpackuswb_avx2(auVar27,auVar31);
        *(undefined1 (*) [32])(*pauVar9 + lVar5) = auVar27;
        pauVar7 = pauVar7 + 0x10;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + dst_stride * 2);
        h = h + -2;
      } while (h != 0);
      break;
    case 3:
      auVar21 = *(undefined1 (*) [32])im_block;
      auVar24 = *(undefined1 (*) [32])(im_block + 0x10);
      pauVar7 = (undefined1 (*) [32])(im_block + 0x50);
      auVar29._8_4_ = 0x400;
      auVar29._0_8_ = 0x40000000400;
      auVar29._12_4_ = 0x400;
      auVar29._16_4_ = 0x400;
      auVar29._20_4_ = 0x400;
      auVar29._24_4_ = 0x400;
      auVar29._28_4_ = 0x400;
      do {
        auVar16 = pauVar7[-3];
        auVar25 = pauVar7[-2];
        auVar28 = vpunpcklwd_avx2(auVar21,auVar16);
        auVar22 = vpunpckhwd_avx2(auVar21,auVar16);
        auVar21 = vpmaddwd_avx2(auVar28,auVar12);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar28 = vpunpcklwd_avx2(auVar24,auVar25);
        auVar24 = vpunpckhwd_avx2(auVar24,auVar25);
        auVar28 = vpmaddwd_avx2(auVar28,auVar12);
        auVar30 = vpmaddwd_avx2(auVar24,auVar12);
        auVar24 = vpaddd_avx2(auVar21,auVar29);
        auVar21 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpaddd_avx2(auVar22,auVar29);
        auVar24 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar21,auVar24);
        auVar21 = vpaddd_avx2(auVar28,auVar29);
        auVar22 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpaddd_avx2(auVar30,auVar29);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpackssdw_avx2(auVar22,auVar21);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        *(undefined1 (*) [32])dst = auVar24;
        auVar21 = pauVar7[-1];
        auVar24 = *pauVar7;
        auVar28 = vpunpcklwd_avx2(auVar16,auVar21);
        auVar22 = vpunpckhwd_avx2(auVar16,auVar21);
        auVar16 = vpmaddwd_avx2(auVar28,auVar12);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar30 = vpunpcklwd_avx2(auVar25,auVar24);
        auVar28 = vpunpckhwd_avx2(auVar25,auVar24);
        auVar25 = vpmaddwd_avx2(auVar30,auVar12);
        auVar28 = vpmaddwd_avx2(auVar28,auVar12);
        auVar16 = vpaddd_avx2(auVar16,auVar29);
        auVar30 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpaddd_avx2(auVar22,auVar29);
        auVar16 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpackssdw_avx2(auVar30,auVar16);
        auVar25 = vpaddd_avx2(auVar25,auVar29);
        auVar22 = vpsrad_avx2(auVar25,0xb);
        auVar25 = vpaddd_avx2(auVar28,auVar29);
        auVar25 = vpsrad_avx2(auVar25,0xb);
        auVar25 = vpackssdw_avx2(auVar22,auVar25);
        auVar16 = vpackuswb_avx2(auVar16,auVar25);
        *(undefined1 (*) [32])(*(undefined1 (*) [32])dst + dst_stride) = auVar16;
        dst = *(undefined1 (*) [32])dst + dst_stride * 2;
        pauVar7 = pauVar7 + 4;
        h = h + -2;
      } while (h != 0);
      break;
    case 7:
      auVar29 = *(undefined1 (*) [32])im_block;
      auVar16 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar21 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar24 = *(undefined1 (*) [32])(im_block + 0x30);
      pauVar7 = (undefined1 (*) [32])(im_block + 0xb0);
      pauVar9 = (undefined1 (*) [32])(dst + 0x20);
      auVar25._8_4_ = 0x400;
      auVar25._0_8_ = 0x40000000400;
      auVar25._12_4_ = 0x400;
      auVar25._16_4_ = 0x400;
      auVar25._20_4_ = 0x400;
      auVar25._24_4_ = 0x400;
      auVar25._28_4_ = 0x400;
      do {
        auVar22 = pauVar7[-7];
        auVar28 = pauVar7[-6];
        auVar13 = vpunpcklwd_avx2(auVar29,auVar22);
        auVar30 = vpunpckhwd_avx2(auVar29,auVar22);
        auVar29 = vpmaddwd_avx2(auVar13,auVar12);
        auVar30 = vpmaddwd_avx2(auVar30,auVar12);
        auVar27 = vpunpcklwd_avx2(auVar16,auVar28);
        auVar13 = vpunpckhwd_avx2(auVar16,auVar28);
        auVar16 = vpmaddwd_avx2(auVar27,auVar12);
        auVar13 = vpmaddwd_avx2(auVar13,auVar12);
        auVar29 = vpaddd_avx2(auVar29,auVar25);
        auVar27 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpaddd_avx2(auVar30,auVar25);
        auVar29 = vpsrad_avx2(auVar29,0xb);
        auVar29 = vpackssdw_avx2(auVar27,auVar29);
        auVar16 = vpaddd_avx2(auVar16,auVar25);
        auVar30 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpaddd_avx2(auVar13,auVar25);
        auVar16 = vpsrad_avx2(auVar16,0xb);
        auVar16 = vpackssdw_avx2(auVar30,auVar16);
        auVar29 = vpackuswb_avx2(auVar29,auVar16);
        pauVar9[-1] = auVar29;
        auVar30 = pauVar7[-5];
        auVar13 = pauVar7[-4];
        auVar16 = vpunpcklwd_avx2(auVar21,auVar30);
        auVar29 = vpunpckhwd_avx2(auVar21,auVar30);
        auVar21 = vpmaddwd_avx2(auVar16,auVar12);
        auVar29 = vpmaddwd_avx2(auVar29,auVar12);
        auVar16 = vpunpcklwd_avx2(auVar24,auVar13);
        auVar24 = vpunpckhwd_avx2(auVar24,auVar13);
        auVar16 = vpmaddwd_avx2(auVar16,auVar12);
        auVar27 = vpmaddwd_avx2(auVar24,auVar12);
        auVar24 = vpaddd_avx2(auVar21,auVar25);
        auVar21 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpaddd_avx2(auVar29,auVar25);
        auVar24 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar21,auVar24);
        auVar21 = vpaddd_avx2(auVar16,auVar25);
        auVar29 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpaddd_avx2(auVar27,auVar25);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpackssdw_avx2(auVar29,auVar21);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        *pauVar9 = auVar24;
        auVar29 = pauVar7[-3];
        auVar16 = pauVar7[-2];
        auVar24 = vpunpcklwd_avx2(auVar22,auVar29);
        auVar21 = vpunpckhwd_avx2(auVar22,auVar29);
        auVar24 = vpmaddwd_avx2(auVar24,auVar12);
        auVar21 = vpmaddwd_avx2(auVar21,auVar12);
        auVar22 = vpunpcklwd_avx2(auVar28,auVar16);
        auVar28 = vpunpckhwd_avx2(auVar28,auVar16);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar28 = vpmaddwd_avx2(auVar28,auVar12);
        auVar24 = vpaddd_avx2(auVar24,auVar25);
        auVar27 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpaddd_avx2(auVar21,auVar25);
        auVar24 = vpsrad_avx2(auVar24,0xb);
        auVar24 = vpackssdw_avx2(auVar27,auVar24);
        auVar21 = vpaddd_avx2(auVar22,auVar25);
        auVar22 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpaddd_avx2(auVar28,auVar25);
        auVar21 = vpsrad_avx2(auVar21,0xb);
        auVar21 = vpackssdw_avx2(auVar22,auVar21);
        auVar24 = vpackuswb_avx2(auVar24,auVar21);
        *(undefined1 (*) [32])(pauVar9[-1] + dst_stride) = auVar24;
        auVar21 = pauVar7[-1];
        auVar24 = *pauVar7;
        auVar22 = vpunpcklwd_avx2(auVar30,auVar21);
        auVar28 = vpunpckhwd_avx2(auVar30,auVar21);
        auVar22 = vpmaddwd_avx2(auVar22,auVar12);
        auVar28 = vpmaddwd_avx2(auVar28,auVar12);
        auVar30 = vpunpcklwd_avx2(auVar13,auVar24);
        auVar13 = vpunpckhwd_avx2(auVar13,auVar24);
        auVar30 = vpmaddwd_avx2(auVar30,auVar12);
        auVar13 = vpmaddwd_avx2(auVar13,auVar12);
        auVar22 = vpaddd_avx2(auVar22,auVar25);
        auVar27 = vpsrad_avx2(auVar22,0xb);
        auVar22 = vpaddd_avx2(auVar28,auVar25);
        auVar22 = vpsrad_avx2(auVar22,0xb);
        auVar22 = vpackssdw_avx2(auVar27,auVar22);
        auVar28 = vpaddd_avx2(auVar30,auVar25);
        auVar30 = vpsrad_avx2(auVar28,0xb);
        auVar28 = vpaddd_avx2(auVar13,auVar25);
        auVar28 = vpsrad_avx2(auVar28,0xb);
        auVar28 = vpackssdw_avx2(auVar30,auVar28);
        auVar22 = vpackuswb_avx2(auVar22,auVar28);
        *(undefined1 (*) [32])(*pauVar9 + dst_stride) = auVar22;
        pauVar7 = pauVar7 + 8;
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + dst_stride * 2);
        h = h + -2;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_2tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y = h;

  if (w <= 4) {
    __m128i coeffs_128;

    prepare_coeffs_2tap_sse2(filter_params_y, subpel_y_q4, &coeffs_128);

    if (w == 2) {
      __m128i s_32[2];

      s_32[0] = _mm_cvtsi32_si128(*(int32_t *)im);

      do {
        const __m128i res = xy_y_convolve_2tap_2x2_sse2(im, s_32, &coeffs_128);
        xy_y_round_store_2x2_sse2(res, dst, dst_stride);
        im += 2 * 2;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else {
      __m128i s_64[2], r[2];

      assert(w == 4);

      s_64[0] = _mm_loadl_epi64((__m128i *)im);

      do {
        xy_y_convolve_2tap_4x2_sse2(im, s_64, &coeffs_128, r);
        r[0] = xy_y_round_sse2(r[0]);
        r[1] = xy_y_round_sse2(r[1]);
        const __m128i rr = _mm_packs_epi32(r[0], r[1]);
        pack_store_4x2_sse2(rr, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256;

    prepare_coeffs_2tap_avx2(filter_params_y, subpel_y_q4, &coeffs_256);

    if (w == 8) {
      __m128i s_128[2];
      __m256i r[2];

      s_128[0] = _mm_loadu_si128((__m128i *)im);

      do {
        xy_y_convolve_2tap_8x2_avx2(im, s_128, &coeffs_256, r);
        xy_y_round_store_8x2_avx2(r, dst, dst_stride);
        im += 2 * 8;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      __m256i s_256[2], r[4];

      s_256[0] = _mm256_loadu_si256((__m256i *)im);

      do {
        xy_y_convolve_2tap_16x2_avx2(im, s_256, &coeffs_256, r);
        xy_y_round_store_16x2_avx2(r, dst, dst_stride);
        im += 2 * 16;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      __m256i s_256[2][2];

      s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[0], s_256[1], &coeffs_256,
                                       dst);
        im += 2 * 32;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1], s_256[0], &coeffs_256,
                                       dst + dst_stride);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 64) {
      __m256i s_256[2][4];

      s_256[0][0] = _mm256_loadu_si256((__m256i *)(im + 0 * 16));
      s_256[0][1] = _mm256_loadu_si256((__m256i *)(im + 1 * 16));
      s_256[0][2] = _mm256_loadu_si256((__m256i *)(im + 2 * 16));
      s_256[0][3] = _mm256_loadu_si256((__m256i *)(im + 3 * 16));

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 64, s_256[0] + 0, s_256[1] + 0,
                                       &coeffs_256, dst);
        xy_y_convolve_2tap_32_all_avx2(im + 96, s_256[0] + 2, s_256[1] + 2,
                                       &coeffs_256, dst + 32);
        im += 2 * 64;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                       &coeffs_256, dst + dst_stride);
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[1] + 2, s_256[0] + 2,
                                       &coeffs_256, dst + dst_stride + 32);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else {
      __m256i s_256[2][8];

      assert(w == 128);

      load_16bit_8rows_avx2(im, 16, s_256[0]);

      do {
        xy_y_convolve_2tap_32_all_avx2(im + 128, s_256[0] + 0, s_256[1] + 0,
                                       &coeffs_256, dst);
        xy_y_convolve_2tap_32_all_avx2(im + 160, s_256[0] + 2, s_256[1] + 2,
                                       &coeffs_256, dst + 1 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 192, s_256[0] + 4, s_256[1] + 4,
                                       &coeffs_256, dst + 2 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 224, s_256[0] + 6, s_256[1] + 6,
                                       &coeffs_256, dst + 3 * 32);
        im += 2 * 128;
        xy_y_convolve_2tap_32_all_avx2(im, s_256[1] + 0, s_256[0] + 0,
                                       &coeffs_256, dst + dst_stride);
        xy_y_convolve_2tap_32_all_avx2(im + 32, s_256[1] + 2, s_256[0] + 2,
                                       &coeffs_256, dst + dst_stride + 1 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 64, s_256[1] + 4, s_256[0] + 4,
                                       &coeffs_256, dst + dst_stride + 2 * 32);
        xy_y_convolve_2tap_32_all_avx2(im + 96, s_256[1] + 6, s_256[0] + 6,
                                       &coeffs_256, dst + dst_stride + 3 * 32);
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    }
  }
}